

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2)

{
  long lVar1;
  ArrayPtr<const_char> *pAVar2;
  long local_28;
  undefined1 *local_20;
  StringPtr local_18;
  
  lVar1 = param_2[1];
  local_28 = lVar1;
  if (lVar1 != 0) {
    local_28 = *param_2;
  }
  local_20 = (undefined1 *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_20 = (undefined1 *)0x0;
  }
  pAVar2 = (ArrayPtr<const_char> *)param_2[4];
  local_18.content.ptr = (char *)pAVar2;
  if (pAVar2 != (ArrayPtr<const_char> *)0x0) {
    local_18.content.ptr = (char *)param_2[3];
  }
  local_18.content.size_ = (size_t)((long)&pAVar2[-1].size_ + 7);
  if (pAVar2 == (ArrayPtr<const_char> *)0x0) {
    local_18.content.size_ = (size_t)(undefined1 *)0x0;
  }
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)(param_2 + 6),&local_18,
             (ArrayPtr<const_char> *)local_18.content.ptr);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}